

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O3

Items * GherkinLine_table_cells(GherkinLine_conflict *line)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  _Bool _Var4;
  wchar_t *pwVar5;
  Span *pSVar6;
  wchar_t **ppwVar7;
  Items *pIVar8;
  size_t sVar9;
  wchar_t *pwVar10;
  long lVar11;
  wchar_t *pwVar12;
  long lVar13;
  wchar_t *current_pos;
  ulong uVar14;
  int iVar15;
  wchar_t wVar16;
  wchar_t *pwVar17;
  long lVar18;
  
  pwVar12 = line->trimmed_line;
  if (pwVar12 != (wchar_t *)0x0) {
    wVar16 = *pwVar12;
    iVar15 = 0;
    pwVar5 = pwVar12;
    if (wVar16 != L'\0') {
      do {
        while (wVar16 == L'\\') {
          pwVar5 = pwVar5 + 1;
LAB_00121b0b:
          wVar16 = pwVar5[1];
          pwVar5 = pwVar5 + 1;
        }
        if (wVar16 == L'\0') break;
        if (wVar16 != L'|') goto LAB_00121b0b;
        iVar15 = iVar15 + 1;
        wVar16 = pwVar5[1];
        pwVar5 = pwVar5 + 1;
      } while (wVar16 != L'\0');
      wVar16 = iVar15 + L'\xffffffff';
      if (iVar15 == 0) {
        wVar16 = L'\0';
      }
      if (iVar15 == 0 || iVar15 + L'\xffffffff' == L'\0') {
        return (Items *)0x0;
      }
      lVar18 = (long)wVar16;
      pSVar6 = (Span *)malloc(lVar18 << 4);
      if (wVar16 < L'\x01') {
        pIVar8 = (Items *)malloc(0x10);
        pIVar8->count = wVar16;
        pIVar8->items = pSVar6;
        return pIVar8;
      }
      ppwVar7 = &pSVar6->text;
      lVar11 = 0;
      do {
        ((Span *)(ppwVar7 + -1))->column = L'\0';
        *ppwVar7 = (wchar_t *)0x0;
        lVar11 = lVar11 + 1;
        ppwVar7 = ppwVar7 + 2;
      } while (lVar11 < lVar18);
      pIVar8 = (Items *)malloc(0x10);
      pIVar8->count = wVar16;
      pIVar8->items = pSVar6;
      if (wVar16 < L'\x01') {
        return pIVar8;
      }
      lVar11 = 0;
LAB_00121b82:
      pwVar5 = line->line_text;
      pwVar10 = pwVar12;
      do {
        wVar16 = *pwVar10;
        if (wVar16 == L'\\') {
          pwVar10 = pwVar10 + 1;
        }
        else {
          if (wVar16 == L'\0') {
            return pIVar8;
          }
          if (wVar16 == L'|') goto LAB_00121bbb;
        }
        pwVar10 = pwVar10 + 1;
      } while( true );
    }
  }
  return (Items *)0x0;
LAB_00121bbb:
  pwVar17 = pwVar10 + 1;
  lVar13 = 4;
  do {
    iVar15 = *(int *)((long)pwVar10 + lVar13);
    if (iVar15 == 0x5c) {
      lVar13 = lVar13 + 4;
    }
    else {
      if (iVar15 == 0) {
        return pIVar8;
      }
      if (iVar15 == 0x7c) break;
    }
    lVar13 = lVar13 + 4;
  } while( true );
  pwVar2 = (wchar_t *)(lVar13 + (long)pwVar10);
  if (4 < lVar13) {
    do {
      _Var4 = StringUtilities_is_whitespace(*pwVar17);
      if (!_Var4) break;
      pwVar17 = pwVar17 + 1;
    } while (pwVar17 < pwVar2);
  }
  uVar3 = (long)pwVar10 + (lVar13 - (long)pwVar17);
  pwVar10 = pwVar2;
  do {
    uVar14 = uVar3;
    if (pwVar10 <= pwVar17) break;
    pwVar1 = pwVar10 + -1;
    pwVar10 = pwVar10 + -1;
    _Var4 = StringUtilities_is_whitespace(*pwVar1);
    uVar3 = uVar14 - 4;
  } while (_Var4);
  sVar9 = StringUtilities_code_point_length_for_part
                    (pwVar12,(wchar_t)((ulong)((long)pwVar17 - (long)pwVar12) >> 2));
  pSVar6[lVar11].column = (int)sVar9 + (int)((ulong)((long)pwVar12 - (long)pwVar5) >> 2) + L'\x01';
  pwVar10 = StringUtilities_copy_string_part(pwVar17,(wchar_t)(uVar14 >> 2));
  pwVar12 = pwVar10;
  pwVar5 = pwVar10;
LAB_00121c95:
  while (pwVar17 = pwVar5, wVar16 = *pwVar17, wVar16 == L'\\') {
    wVar16 = pwVar17[1];
    if ((wVar16 == L'\\') || (wVar16 == L'|')) goto LAB_00121ce2;
    if (wVar16 != L'n') goto LAB_00121cce;
    *pwVar12 = L'\n';
    pwVar12 = pwVar12 + 1;
    pwVar5 = pwVar17 + 2;
  }
  if (wVar16 != L'\0') {
    pwVar5 = pwVar17 + 1;
    goto LAB_00121ce6;
  }
  *pwVar12 = L'\0';
  pSVar6[lVar11].text = pwVar10;
  lVar11 = lVar11 + 1;
  pwVar12 = pwVar2;
  if (lVar18 <= lVar11) {
    return pIVar8;
  }
  goto LAB_00121b82;
LAB_00121cce:
  *pwVar12 = L'\\';
  pwVar12 = pwVar12 + 1;
  wVar16 = pwVar17[1];
  pwVar5 = pwVar17 + 1;
  if (wVar16 != L'\0') {
LAB_00121ce2:
    pwVar5 = pwVar17 + 2;
LAB_00121ce6:
    *pwVar12 = wVar16;
    pwVar12 = pwVar12 + 1;
  }
  goto LAB_00121c95;
}

Assistant:

const Items* GherkinLine_table_cells(const GherkinLine* line) {
    int item_count = calculate_cell_count(line->trimmed_line);
    if (item_count == 0)
        return (Items*)0;
    Span* items = (Span*)malloc(item_count * sizeof(Span));
    int i;
    for (i = 0; i < item_count; ++i) {
        items[i].column = 0;
        items[i].text = 0;
    }
    Items* item_array = (Items*)malloc(sizeof(Items));
    item_array->count = item_count;
    item_array->items = items;
    const wchar_t* current_pos = line->trimmed_line;
    for (i = 0; i < item_count; ++i) {
        current_pos = populate_cell_data(&items[i], current_pos, current_pos - line->line_text);
        if (!current_pos)
            break;
    }
    return item_array;
}